

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall CircularArrayTest_at_Test::TestBody(CircularArrayTest_at_Test *this)

{
  int line;
  char *message;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  Message local_60;
  undefined1 local_58 [16];
  AssertHelper local_48;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_40;
  
  local_40.contents_._M_elems[0].data = 0;
  local_40.contents_._M_elems[0].data2 = 0;
  local_40.contents_._M_elems[0].moved = false;
  local_40.contents_._M_elems[1].data = 0;
  local_40.contents_._M_elems[1].data2 = 0;
  local_40.contents_._M_elems[1].moved = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 3;
  local_40.size_ = 0;
  local_40.front_ = 0;
  local_58._0_4_ = 1;
  local_58._4_4_ = 0;
  local_58[8] = false;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_40,(value_type *)local_58);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_58._0_4_ = 2;
  local_58._4_4_ = 0;
  local_58[8] = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 1;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_40,(value_type *)local_58);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  if (local_40.size_ == 0) {
LAB_00140cad:
    __assert_fail("index < size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                  ,0x34,
                  "reference wabt::CircularArray<(anonymous namespace)::TestObject, 2>::at(size_type) [T = (anonymous namespace)::TestObject, kCapacity = 2]"
                 );
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"1","ca.at(0).data",(int *)&local_60,
             &local_40.contents_._M_elems[(uint)local_40.front_ & 1].data);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if ((undefined8 *)CONCAT71(local_58._9_7_,local_58[8]) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_58._9_7_,local_58[8]);
    }
    line = 0x78;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_58._9_7_,local_58[8]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_58 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_58._9_7_,local_58[8]));
    }
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 2;
    if (local_40.size_ < 2) goto LAB_00140cad;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"2","ca.at(1).data",(int *)&local_60,
               &local_40.contents_._M_elems[~(uint)local_40.front_ & 1].data);
    if (local_58[0] != (internal)0x0) goto LAB_00140c85;
    testing::Message::Message(&local_60);
    if ((undefined8 *)CONCAT71(local_58._9_7_,local_58[8]) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_58._9_7_,local_58[8]);
    }
    line = 0x79;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_48,&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((long *)CONCAT44(local_60.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_60.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_60.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_00140c85:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_58._9_7_,local_58[8]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_58._9_7_,local_58[8]));
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_40);
  return;
}

Assistant:

TEST_F(CircularArrayTest, at) {
  CircularArray<TestObject, 2> ca;
  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, ca.at(0).data);
  ASSERT_EQ(2, ca.at(1).data);
}